

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void printRep(myRep *rep,int len)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  pointer pRVar4;
  int local_250;
  int i;
  _Self local_240;
  _List_node_base *local_238;
  int local_22c;
  iterator iStack_228;
  int rr;
  iterator it2;
  ofstream outFile;
  char *filename;
  int repNum;
  int len_local;
  myRep *rep_local;
  
  pcVar2 = catStrIntStr("/home/ws/zzZyj/data/rep/rep",1,".txt");
  std::ofstream::ofstream(&it2,pcVar2,_S_out);
  std::_List_iterator<Rep>::_List_iterator(&stack0xfffffffffffffdd8);
  local_22c = 0;
  local_238 = (_List_node_base *)std::__cxx11::list<Rep,_std::allocator<Rep>_>::begin(rep);
  iStack_228 = (iterator)local_238;
  while( true ) {
    local_240._M_node = (_List_node_base *)std::__cxx11::list<Rep,_std::allocator<Rep>_>::end(rep);
    bVar1 = std::operator!=(&stack0xfffffffffffffdd8,&local_240);
    if (!bVar1) break;
    local_22c = local_22c + 1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&it2,local_22c);
    poVar3 = std::operator<<(poVar3," cost[0]=");
    pRVar4 = std::_List_iterator<Rep>::operator->(&stack0xfffffffffffffdd8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pRVar4->Cost);
    poVar3 = std::operator<<(poVar3," cost[1]=");
    pRVar4 = std::_List_iterator<Rep>::operator->(&stack0xfffffffffffffdd8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pRVar4->Cost[1]);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)&it2,"Following is the x,y,z coordinary: ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    for (local_250 = 0; local_250 < len; local_250 = local_250 + 3) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&it2,local_250 / 3 + 1);
      poVar3 = std::operator<<(poVar3," ");
      pRVar4 = std::_List_iterator<Rep>::operator->(&stack0xfffffffffffffdd8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pRVar4->addO_origin[local_250]);
      poVar3 = std::operator<<(poVar3," ");
      pRVar4 = std::_List_iterator<Rep>::operator->(&stack0xfffffffffffffdd8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pRVar4->addO_origin[(long)local_250 + 1]);
      poVar3 = std::operator<<(poVar3," ");
      pRVar4 = std::_List_iterator<Rep>::operator->(&stack0xfffffffffffffdd8);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pRVar4->addO_origin[(long)local_250 + 2]);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<((ostream *)&it2,
                             "------------------------------------------------------------------");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::_List_iterator<Rep>::operator++(&stack0xfffffffffffffdd8,0);
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete(pcVar2);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&it2);
  return;
}

Assistant:

void printRep(myRep & rep, int len){
    int repNum=0;
    repNum++;
    char *filename;
    filename = catStrIntStr("/home/ws/zzZyj/data/rep/rep", repNum, ".txt");
    ofstream outFile(filename);
    myRep ::iterator it2;
    int rr=0;
    for (it2=rep.begin(); it2!= rep.end(); it2++){
        rr++;
        outFile <<  rr << " cost[0]=" << it2->Cost[0] << " cost[1]=" << it2->Cost[1] << endl;
        outFile << "Following is the x,y,z coordinary: "<< endl;
        for (int i=0; i<len; i+=3){
            outFile<< i/3+1 << " " << it2->addO_origin[i] << " " << it2->addO_origin[i+1] << " " << it2->addO_origin[i+2]<< endl;
        }
        outFile << "------------------------------------------------------------------"<< endl;
    }
    delete filename;
    outFile.close();
}